

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  string_view message_00;
  bool bVar1;
  int iVar2;
  char **args_1;
  int result;
  char *system_message;
  memory_buffer buf;
  buffer<char> *in_stack_fffffffffffffd58;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffd60;
  undefined1 *buffer_size;
  char **in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  buffer<char> *in_stack_fffffffffffffdb0;
  char (*in_stack_fffffffffffffdb8) [7];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffdc0;
  buffer<char> local_238 [17];
  
  buffer_size = &stack0xfffffffffffffdc7;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60.container,(allocator<char> *)in_stack_fffffffffffffd58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdc7);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60.container,(size_t)in_stack_fffffffffffffd58);
  do {
    args_1 = (char **)detail::buffer<char>::operator[]<int>(local_238,0);
    detail::buffer<char>::size(local_238);
    iVar2 = detail::safe_strerror
                      ((int)((ulong)in_stack_fffffffffffffd80 >> 0x20),in_stack_fffffffffffffd78,
                       (size_t)buffer_size);
    if (iVar2 == 0) {
      detail::buffer_appender<char>::buffer_appender
                ((buffer_appender<char> *)in_stack_fffffffffffffd60.container,
                 in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd60.container =
           (buffer<char> *)
           format_to<fmt::v7::detail::buffer_appender<char>,char[7],fmt::v7::basic_string_view<char>&,char*&,true>
                     (in_stack_fffffffffffffdc0.container,in_stack_fffffffffffffdb8,
                      in_stack_fffffffffffffdb0,args_1);
      bVar1 = true;
LAB_0017cd03:
      iVar2 = (int)((ulong)args_1 >> 0x20);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd60.container);
      if (!bVar1) {
        message_00.size_ = (size_t)in_stack_fffffffffffffdc0.container;
        message_00.data_ = *in_stack_fffffffffffffdb8;
        detail::format_error_code(in_stack_fffffffffffffdb0,iVar2,message_00);
      }
      return;
    }
    if (iVar2 != 0x22) {
      bVar1 = false;
      goto LAB_0017cd03;
    }
    in_stack_fffffffffffffd58 = local_238;
    detail::buffer<char>::size(in_stack_fffffffffffffd58);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               in_stack_fffffffffffffd60.container,(size_t)in_stack_fffffffffffffd58);
  } while( true );
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }